

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue JS_ReadModule(BCReaderState *s)

{
  JSContext *ctx_00;
  int iVar1;
  JSReqModuleEntry *pJVar2;
  JSExportEntry *pJVar3;
  JSStarExportEntry *pJVar4;
  JSImportEntry *pJVar5;
  undefined8 *in_RDI;
  JSValue JVar6;
  JSValue JVar7;
  JSImportEntry *mi;
  JSStarExportEntry *se;
  JSExportEntry *me;
  JSReqModuleEntry *rme;
  uint8_t v8;
  int i;
  JSAtom module_name;
  JSModuleDef *m;
  JSValue obj;
  JSContext *ctx;
  BCReaderState *in_stack_000000b0;
  BCReaderState *in_stack_ffffffffffffff58;
  BCReaderState *in_stack_ffffffffffffff60;
  JSModuleDef *pJVar8;
  undefined1 in_stack_ffffffffffffff68 [16];
  JSContext *in_stack_ffffffffffffff78;
  JSContext *in_stack_ffffffffffffff80;
  JSAtom in_stack_ffffffffffffffa4;
  JSContext *in_stack_ffffffffffffffa8;
  int64_t local_50;
  byte local_41;
  int local_40;
  JSModuleDef *local_38;
  undefined4 local_10;
  undefined4 uStack_c;
  int64_t local_8;
  
  ctx_00 = (JSContext *)*in_RDI;
  local_38 = (JSModuleDef *)0x0;
  iVar1 = bc_get_atom(in_stack_ffffffffffffff68._0_8_,(JSAtom *)in_stack_ffffffffffffff60);
  if ((iVar1 == 0) &&
     (local_38 = js_new_module_def(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4),
     local_38 != (JSModuleDef *)0x0)) {
    JVar6.tag._0_4_ = 0xfffffffd;
    JVar6.u.ptr = local_38;
    JVar6.tag._4_4_ = 0xffffffff;
    JVar6 = JS_DupValue(ctx_00,JVar6);
    local_50 = JVar6.tag;
    iVar1 = bc_get_leb128_int(in_stack_ffffffffffffff60,(int *)in_stack_ffffffffffffff58);
    if (iVar1 == 0) {
      if (local_38->req_module_entries_count != 0) {
        local_38->req_module_entries_size = local_38->req_module_entries_count;
        pJVar2 = (JSReqModuleEntry *)
                 js_mallocz(in_stack_ffffffffffffff78,in_stack_ffffffffffffff68._8_8_);
        local_38->req_module_entries = pJVar2;
        if (local_38->req_module_entries == (JSReqModuleEntry *)0x0) goto LAB_0016d1b6;
        for (local_40 = 0; local_40 < local_38->req_module_entries_count; local_40 = local_40 + 1) {
          iVar1 = bc_get_atom(in_stack_ffffffffffffff68._0_8_,(JSAtom *)in_stack_ffffffffffffff60);
          if (iVar1 != 0) goto LAB_0016d1b6;
        }
      }
      iVar1 = bc_get_leb128_int(in_stack_ffffffffffffff60,(int *)in_stack_ffffffffffffff58);
      if (iVar1 == 0) {
        if (local_38->export_entries_count != 0) {
          local_38->export_entries_size = local_38->export_entries_count;
          pJVar3 = (JSExportEntry *)
                   js_mallocz(in_stack_ffffffffffffff78,in_stack_ffffffffffffff68._8_8_);
          local_38->export_entries = pJVar3;
          if (local_38->export_entries == (JSExportEntry *)0x0) goto LAB_0016d1b6;
          for (local_40 = 0; local_40 < local_38->export_entries_count; local_40 = local_40 + 1) {
            pJVar3 = local_38->export_entries;
            iVar1 = bc_get_u8(in_stack_ffffffffffffff58,(uint8_t *)0x16cea4);
            if (iVar1 != 0) goto LAB_0016d1b6;
            pJVar3[local_40].export_type = (uint)local_41;
            if (pJVar3[local_40].export_type == JS_EXPORT_TYPE_LOCAL) {
              iVar1 = bc_get_leb128_int(in_stack_ffffffffffffff60,(int *)in_stack_ffffffffffffff58);
            }
            else {
              iVar1 = bc_get_leb128_int(in_stack_ffffffffffffff60,(int *)in_stack_ffffffffffffff58);
              if (iVar1 != 0) goto LAB_0016d1b6;
              iVar1 = bc_get_atom(in_stack_ffffffffffffff68._0_8_,
                                  (JSAtom *)in_stack_ffffffffffffff60);
            }
            if ((iVar1 != 0) ||
               (iVar1 = bc_get_atom(in_stack_ffffffffffffff68._0_8_,
                                    (JSAtom *)in_stack_ffffffffffffff60), iVar1 != 0))
            goto LAB_0016d1b6;
          }
        }
        iVar1 = bc_get_leb128_int(in_stack_ffffffffffffff60,(int *)in_stack_ffffffffffffff58);
        if (iVar1 == 0) {
          if (local_38->star_export_entries_count != 0) {
            local_38->star_export_entries_size = local_38->star_export_entries_count;
            pJVar4 = (JSStarExportEntry *)
                     js_mallocz(in_stack_ffffffffffffff78,in_stack_ffffffffffffff68._8_8_);
            local_38->star_export_entries = pJVar4;
            if (local_38->star_export_entries == (JSStarExportEntry *)0x0) goto LAB_0016d1b6;
            for (local_40 = 0; local_40 < local_38->star_export_entries_count;
                local_40 = local_40 + 1) {
              in_stack_ffffffffffffff80 = (JSContext *)(local_38->star_export_entries + local_40);
              iVar1 = bc_get_leb128_int(in_stack_ffffffffffffff60,(int *)in_stack_ffffffffffffff58);
              if (iVar1 != 0) goto LAB_0016d1b6;
            }
          }
          iVar1 = bc_get_leb128_int(in_stack_ffffffffffffff60,(int *)in_stack_ffffffffffffff58);
          if (iVar1 == 0) {
            if (local_38->import_entries_count != 0) {
              local_38->import_entries_size = local_38->import_entries_count;
              pJVar5 = (JSImportEntry *)
                       js_mallocz(in_stack_ffffffffffffff78,in_stack_ffffffffffffff68._8_8_);
              local_38->import_entries = pJVar5;
              if (local_38->import_entries == (JSImportEntry *)0x0) goto LAB_0016d1b6;
              for (local_40 = 0; local_40 < local_38->import_entries_count; local_40 = local_40 + 1)
              {
                in_stack_ffffffffffffff78 = (JSContext *)(local_38->import_entries + local_40);
                iVar1 = bc_get_leb128_int(in_stack_ffffffffffffff60,(int *)in_stack_ffffffffffffff58
                                         );
                if (((iVar1 != 0) ||
                    (iVar1 = bc_get_atom(in_stack_ffffffffffffff68._0_8_,
                                         (JSAtom *)in_stack_ffffffffffffff60), iVar1 != 0)) ||
                   (iVar1 = bc_get_leb128_int(in_stack_ffffffffffffff60,
                                              (int *)in_stack_ffffffffffffff58), iVar1 != 0))
                goto LAB_0016d1b6;
              }
            }
            pJVar8 = local_38;
            JVar7 = JS_ReadObjectRec(in_stack_000000b0);
            (pJVar8->func_obj).u = JVar7.u;
            (pJVar8->func_obj).tag = JVar7.tag;
            iVar1 = JS_IsException(local_38->func_obj);
            if (iVar1 == 0) {
              local_10 = JVar6.u._0_4_;
              uStack_c = JVar6.u._4_4_;
              local_8 = local_50;
              goto LAB_0016d1e7;
            }
          }
        }
      }
    }
  }
LAB_0016d1b6:
  if (local_38 != (JSModuleDef *)0x0) {
    js_free_module_def(in_stack_ffffffffffffff80,(JSModuleDef *)in_stack_ffffffffffffff78);
  }
  local_10 = 0;
  local_8 = 6;
LAB_0016d1e7:
  JVar7.u._4_4_ = uStack_c;
  JVar7.u.int32 = local_10;
  JVar7.tag = local_8;
  return JVar7;
}

Assistant:

static JSValue JS_ReadModule(BCReaderState *s)
{
    JSContext *ctx = s->ctx;
    JSValue obj;
    JSModuleDef *m = NULL;
    JSAtom module_name;
    int i;
    uint8_t v8;
    
    if (bc_get_atom(s, &module_name))
        goto fail;
#ifdef DUMP_READ_OBJECT
    bc_read_trace(s, "name: "); print_atom(s->ctx, module_name); printf("\n");
#endif
    m = js_new_module_def(ctx, module_name);
    if (!m)
        goto fail;
    obj = JS_DupValue(ctx, JS_MKPTR(JS_TAG_MODULE, m));
    if (bc_get_leb128_int(s, &m->req_module_entries_count))
        goto fail;
    if (m->req_module_entries_count != 0) {
        m->req_module_entries_size = m->req_module_entries_count;
        m->req_module_entries = js_mallocz(ctx, sizeof(m->req_module_entries[0]) * m->req_module_entries_size);
        if (!m->req_module_entries)
            goto fail;
        for(i = 0; i < m->req_module_entries_count; i++) {
            JSReqModuleEntry *rme = &m->req_module_entries[i];
            if (bc_get_atom(s, &rme->module_name))
                goto fail;
        }
    }

    if (bc_get_leb128_int(s, &m->export_entries_count))
        goto fail;
    if (m->export_entries_count != 0) {
        m->export_entries_size = m->export_entries_count;
        m->export_entries = js_mallocz(ctx, sizeof(m->export_entries[0]) * m->export_entries_size);
        if (!m->export_entries)
            goto fail;
        for(i = 0; i < m->export_entries_count; i++) {
            JSExportEntry *me = &m->export_entries[i];
            if (bc_get_u8(s, &v8))
                goto fail;
            me->export_type = v8;
            if (me->export_type == JS_EXPORT_TYPE_LOCAL) {
                if (bc_get_leb128_int(s, &me->u.local.var_idx))
                    goto fail;
            } else {
                if (bc_get_leb128_int(s, &me->u.req_module_idx))
                    goto fail;
                if (bc_get_atom(s, &me->local_name))
                    goto fail;
            }
            if (bc_get_atom(s, &me->export_name))
                goto fail;
        }
    }

    if (bc_get_leb128_int(s, &m->star_export_entries_count))
        goto fail;
    if (m->star_export_entries_count != 0) {
        m->star_export_entries_size = m->star_export_entries_count;
        m->star_export_entries = js_mallocz(ctx, sizeof(m->star_export_entries[0]) * m->star_export_entries_size);
        if (!m->star_export_entries)
            goto fail;
        for(i = 0; i < m->star_export_entries_count; i++) {
            JSStarExportEntry *se = &m->star_export_entries[i];
            if (bc_get_leb128_int(s, &se->req_module_idx))
                goto fail;
        }
    }

    if (bc_get_leb128_int(s, &m->import_entries_count))
        goto fail;
    if (m->import_entries_count != 0) {
        m->import_entries_size = m->import_entries_count;
        m->import_entries = js_mallocz(ctx, sizeof(m->import_entries[0]) * m->import_entries_size);
        if (!m->import_entries)
            goto fail;
        for(i = 0; i < m->import_entries_count; i++) {
            JSImportEntry *mi = &m->import_entries[i];
            if (bc_get_leb128_int(s, &mi->var_idx))
                goto fail;
            if (bc_get_atom(s, &mi->import_name))
                goto fail;
            if (bc_get_leb128_int(s, &mi->req_module_idx))
                goto fail;
        }
    }

    m->func_obj = JS_ReadObjectRec(s);
    if (JS_IsException(m->func_obj))
        goto fail;
    return obj;
 fail:
    if (m) {
        js_free_module_def(ctx, m);
    }
    return JS_EXCEPTION;
}